

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

void __thiscall Liby::UdpSocket::handleWritEvent(UdpSocket *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  element_type *this_00;
  element_type *this_01;
  char *pcVar4;
  void *__buf;
  ssize_t sVar5;
  off_t oVar6;
  type this_02;
  type in_stack_ffffffffffffff28;
  int n;
  element_type *buffer;
  value_type *first;
  anon_class_8_1_8991fb9c local_68;
  function<void_()> local_60;
  DeferCaller local_40;
  undefined1 local_20 [8];
  shared_ptr<Liby::UdpSocket> self;
  UdpSocket *this_local;
  
  self.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::shared_ptr<Liby::UdpSocket>::shared_ptr((shared_ptr<Liby::UdpSocket> *)local_20,&this->self_)
  ;
  local_68.this = this;
  std::function<void()>::function<Liby::UdpSocket::handleWritEvent()::__0,void>
            ((function<void()> *)&local_60,&local_68);
  DeferCaller::DeferCaller(&local_40,&local_60);
  DeferCaller::~DeferCaller(&local_40);
  std::function<void_()>::~function(&local_60);
  do {
    bVar1 = std::deque<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::empty
                      (&this->writTasks_);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0013fbbe:
      std::shared_ptr<Liby::UdpSocket>::~shared_ptr((shared_ptr<Liby::UdpSocket> *)local_20);
      return;
    }
    pvVar3 = std::deque<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::front
                       (&this->writTasks_);
    this_00 = std::__shared_ptr_access<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pvVar3->buffer_);
    this_01 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->socket_);
    pcVar4 = Buffer::data(this_00);
    __buf = (void *)Buffer::size(this_00);
    sVar5 = Socket::sendto(this_01,(int)pcVar4,__buf,0,(int)pvVar3->dest_,(sockaddr *)0x10,
                           (socklen_t)in_stack_ffffffffffffff28);
    iVar2 = (int)sVar5;
    if (iVar2 < 0) {
      if (iVar2 != 0xb) {
        handleErroEvent(this);
      }
      goto LAB_0013fbbe;
    }
    Buffer::retrieve(this_00,(long)iVar2);
    oVar6 = Buffer::size(this_00);
    if (oVar6 == 0) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pvVar3->handler_);
      if (bVar1) {
        this_02 = std::
                  unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
                  ::operator*(&pvVar3->handler_);
        bVar1 = std::function::operator_cast_to_bool((function *)this_02);
        if (bVar1) {
          in_stack_ffffffffffffff28 =
               std::
               unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
               operator*(&pvVar3->handler_);
          std::function<void_()>::operator()(in_stack_ffffffffffffff28);
        }
      }
      std::deque<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::pop_front
                (&this->writTasks_);
    }
  } while( true );
}

Assistant:

void UdpSocket::handleWritEvent() {
    auto self = self_;
    DeferCaller([this] {
        if (destroy_)
            return;
        if (writTasks_.empty())
            enableWrit(false);
    });

    while (!writTasks_.empty()) {
        auto &first = writTasks_.front();
        auto &buffer = *(first.buffer_);

        int n = socket_->sendto(buffer.data(), buffer.size(), 0,
                                (struct sockaddr *)first.dest_,
                                sizeof(struct sockaddr_in));

        if (n < 0) {
            if (n != EAGAIN) {
                handleErroEvent();
            }
            break;
        }

        buffer.retrieve(n);
        if (buffer.size() == 0) {
            if (first.handler_ && *(first.handler_))
                (*first.handler_)();
            writTasks_.pop_front();
        }
    }
}